

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O2

void common_ngram_cache_draft
               (vector<int,_std::allocator<int>_> *inp,vector<int,_std::allocator<int>_> *draft,
               int n_draft,int ngram_min,int ngram_max,common_ngram_cache *nc_context,
               common_ngram_cache *nc_dynamic,common_ngram_cache *nc_static)

{
  size_t sVar1;
  int iVar2;
  llama_token lVar3;
  pointer piVar4;
  iterator iVar5;
  long *plVar6;
  common_log *log;
  long lVar7;
  int ngram_size_cd;
  uint uVar8;
  int iVar9;
  int iVar10;
  int32_t count_static;
  int iVar11;
  pointer piVar12;
  long lVar13;
  llama_token drafted_token;
  uint local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  long local_100;
  vector<common_ngram,_std::allocator<common_ngram>_> ngrams_cd;
  common_ngram ngram_static;
  int local_b8;
  common_ngram_cache_part part_static;
  key_type local_78;
  common_ngram ngram_cd;
  long local_58 [5];
  
  piVar4 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar12 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  local_114 = ngram_min;
  local_10c = n_draft;
  local_108 = ngram_max;
  if ((long)piVar12 - (long)piVar4 != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
               ,0x96,"GGML_ASSERT(%s) failed","draft.size() == 1");
  }
  local_100 = (long)(inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2;
  local_110 = (int)local_100;
  if (1 < local_110) {
    local_b8 = local_110 + -2;
    local_110 = ~ngram_min + local_110;
    while (iVar11 = (int)((long)piVar12 - (long)piVar4 >> 2), iVar11 <= local_10c) {
      drafted_token = -1;
      common_ngram::common_ngram(&ngram_static);
      lVar13 = (ulong)(uint)(iVar11 + local_b8) << 0x20;
      for (lVar7 = 0; sVar1 = lVar7 + (lVar13 + -0x100000000 >> 0x20),
          (long)sVar1 < lVar13 + 0x100000000 >> 0x20; lVar7 = lVar7 + 1) {
        lVar3 = get_token(inp,draft,sVar1);
        ngram_static.tokens[lVar7] = lVar3;
      }
      iVar5 = std::
              _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&nc_static->_M_h,&ngram_static);
      part_static._M_h._M_buckets = &part_static._M_h._M_single_bucket;
      part_static._M_h._M_bucket_count = 1;
      part_static._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      part_static._M_h._M_element_count = 0;
      part_static._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      part_static._M_h._M_rehash_policy._M_next_resize = 0;
      part_static._M_h._M_single_bucket = (__node_base_ptr)0x0;
      if (iVar5.
          super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
          ._M_cur != (__node_type *)0x0) {
        std::
        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::operator=(&part_static._M_h,
                    (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)((long)iVar5.
                              super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                              ._M_cur + 0x18));
      }
      ngrams_cd.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ngrams_cd.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ngrams_cd.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar11 = local_110;
      for (uVar8 = local_114; (int)uVar8 <= local_108; uVar8 = uVar8 + 1) {
        piVar4 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        piVar12 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar10 = ~uVar8 + (int)local_100;
        common_ngram::common_ngram(&ngram_cd);
        iVar9 = (int)((ulong)((long)piVar4 - (long)piVar12) >> 2);
        local_104 = iVar11;
        for (lVar7 = 0; sVar1 = (iVar9 + iVar11) + lVar7,
            (long)sVar1 < (long)(int)(iVar10 + uVar8 + iVar9); lVar7 = lVar7 + 1) {
          lVar3 = get_token(inp,draft,sVar1);
          ngram_cd.tokens[lVar7] = lVar3;
        }
        std::vector<common_ngram,_std::allocator<common_ngram>_>::push_back(&ngrams_cd,&ngram_cd);
        iVar11 = local_104 + -1;
      }
      if (((drafted_token == -1) &&
          (drafted_token =
                try_draft(nc_context,&ngrams_cd,&part_static,draft_min_sample_size_lax,
                          draft_min_percent_lax), drafted_token == -1)) &&
         (drafted_token =
               try_draft(nc_dynamic,&ngrams_cd,&part_static,draft_min_sample_size_strict,
                         draft_min_percent_strict), drafted_token == -1)) {
        local_78.tokens[0] = ngram_static.tokens[0];
        local_78.tokens[1] = ngram_static.tokens[1];
        local_78.tokens[2] = ngram_static.tokens[2];
        local_78.tokens[3] = ngram_static.tokens[3];
        iVar5 = std::
                _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&nc_static->_M_h,&local_78);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&ngram_cd,
                       (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                                 ._M_cur + 0x18));
          iVar10 = 0;
          plVar6 = local_58;
          iVar11 = -1;
          iVar9 = 0;
          while (plVar6 = (long *)*plVar6, plVar6 != (long *)0x0) {
            iVar2 = *(int *)((long)plVar6 + 0xc);
            if (iVar9 < iVar2) {
              iVar11 = *(int *)(plVar6 + 1);
              iVar9 = iVar2;
            }
            iVar10 = iVar10 + iVar2;
          }
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&ngram_cd);
          if ((1 < iVar10) &&
             (SBORROW4(iVar9 * 100,iVar10 * 0x32) == iVar9 * 100 + iVar10 * -0x32 < 0)) {
            drafted_token = iVar11;
            if (iVar11 == -1) goto LAB_001caa9f;
            goto LAB_001caa47;
          }
        }
        drafted_token = -1;
LAB_001caa9f:
        std::_Vector_base<common_ngram,_std::allocator<common_ngram>_>::~_Vector_base
                  (&ngrams_cd.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>);
        std::
        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&part_static._M_h);
        return;
      }
LAB_001caa47:
      if (-1 < common_log_verbosity_thold) {
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_NONE," - draft candidate: token=%d\n",
                       (ulong)(uint)drafted_token);
      }
      std::vector<int,_std::allocator<int>_>::push_back(draft,&drafted_token);
      std::_Vector_base<common_ngram,_std::allocator<common_ngram>_>::~_Vector_base
                (&ngrams_cd.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>);
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&part_static._M_h);
      piVar4 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar12 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void common_ngram_cache_draft(
    std::vector<llama_token> & inp, std::vector<llama_token> & draft, int n_draft, int ngram_min, int ngram_max,
    common_ngram_cache & nc_context, common_ngram_cache & nc_dynamic, common_ngram_cache & nc_static
) {
    GGML_ASSERT(draft.size() == 1);
    const int inp_size = inp.size();

    if (inp_size < LLAMA_NGRAM_STATIC) {
        return;
    }

    while ((int) draft.size()-1 < n_draft) {
        llama_token drafted_token = LLAMA_TOKEN_NULL;

        const int ngram_start_static = inp_size-LLAMA_NGRAM_STATIC + draft.size()-1;
        common_ngram ngram_static;
        for (int j = ngram_start_static; j < ngram_start_static + LLAMA_NGRAM_STATIC; ++j) {
            ngram_static.tokens[j-ngram_start_static] = get_token(inp, draft, j);
        }
        common_ngram_cache::iterator part_static_it = nc_static.find(ngram_static);
        common_ngram_cache_part part_static;
        if (part_static_it != nc_static.end()) {
            part_static = part_static_it->second;
        }

        // cd = context + dynamic
        std::vector<common_ngram> ngrams_cd;
        for (int ngram_size_cd = ngram_min; ngram_size_cd <= ngram_max; ++ngram_size_cd) {
            const int ngram_start_cd = inp_size-ngram_size_cd + draft.size()-1;
            common_ngram ngram_cd;
            for (int j = ngram_start_cd; j < ngram_start_cd + ngram_size_cd; ++j) {
                ngram_cd.tokens[j-ngram_start_cd] = get_token(inp, draft, j);
            }
            ngrams_cd.push_back(ngram_cd);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_context, ngrams_cd, part_static, draft_min_sample_size_lax, draft_min_percent_lax);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_dynamic, ngrams_cd, part_static, draft_min_sample_size_strict, draft_min_percent_strict);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_static, ngram_static);
        }

        if (drafted_token == LLAMA_TOKEN_NULL) {
            break;
        }

        LOG(" - draft candidate: token=%d\n", drafted_token);
        draft.push_back(drafted_token);
    }
}